

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O3

void __thiscall QGraphicsScene::drawBackground(QGraphicsScene *this,QPainter *painter,QRectF *rect)

{
  long lVar1;
  long in_FS_OFFSET;
  undefined8 local_38;
  undefined8 uStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 8);
  if (*(int *)(*(long *)(lVar1 + 0x170) + 4) != 0) {
    if ((*(byte *)(lVar1 + 0xb9) & 0x40) != 0) {
      QPainter::save();
    }
    local_38 = 0;
    uStack_30 = 0;
    QPainter::setBrushOrigin((QPointF *)painter);
    QBrush::QBrush((QBrush *)&local_38,(QBrush *)(*(long *)(this + 8) + 0x170));
    QPainter::fillRect((QRectF *)painter,(QBrush *)rect);
    QBrush::~QBrush((QBrush *)&local_38);
    if ((*(byte *)(lVar1 + 0xb9) & 0x40) != 0) {
      QPainter::restore();
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsScene::drawBackground(QPainter *painter, const QRectF &rect)
{
    Q_D(QGraphicsScene);

    if (d->backgroundBrush.style() != Qt::NoBrush) {
        if (d->painterStateProtection)
            painter->save();
        painter->setBrushOrigin(0, 0);
        painter->fillRect(rect, backgroundBrush());
        if (d->painterStateProtection)
            painter->restore();
    }
}